

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::~EventLoop(EventLoop *this)

{
  long in_FS_OFFSET;
  
  if (this->looping_ != true) {
    *(undefined8 *)(in_FS_OFFSET + -0x40) = 0;
    close(this->wakeupFd_);
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
              (&this->pendingFuntors_);
    pthread_mutex_destroy((pthread_mutex_t *)&this->mutex_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(this->wakeupChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
              (&this->activeChannels_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(this->timer_).super___shared_ptr<TimerHeap,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(this->poller_).super___shared_ptr<EPoller,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    return;
  }
  __assert_fail("!looping_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                ,0x27,"EventLoop::~EventLoop()");
}

Assistant:

EventLoop::~EventLoop() {
    assert(!looping_);
    t_loopInThisThread = NULL;
    close(wakeupFd_);
}